

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall wasm::PrintExpressionContents::visitLoad(PrintExpressionContents *this,Load *curr)

{
  Type *this_00;
  byte bVar1;
  uint8_t uVar2;
  ulong uVar3;
  uint uVar4;
  ostream *poVar5;
  Type type;
  char *pcVar6;
  Module *in_R8;
  Name name;
  
  poVar5 = prepareColor(this->o);
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type;
  uVar4 = (uint)(curr->align).addr;
  type.id = 6;
  if (uVar4 < 0x10) {
    type.id = 3 - (ulong)(uVar4 < 8);
  }
  uVar3 = (curr->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression.type.id;
  if (1 < uVar3) {
    type.id = uVar3;
  }
  wasm::operator<<(poVar5,type);
  if (curr->isAtomic == true) {
    std::operator<<(this->o,".atomic");
  }
  std::operator<<(this->o,".load");
  if (this_00->id == 1) goto LAB_00b1efd7;
  bVar1 = curr->bytes;
  uVar4 = wasm::Type::getByteSize(this_00);
  if (uVar4 <= bVar1) goto LAB_00b1efd7;
  uVar2 = curr->bytes;
  if (uVar2 == '\x04') {
    poVar5 = this->o;
    pcVar6 = "32";
LAB_00b1efad:
    std::operator<<(poVar5,pcVar6);
  }
  else {
    if (uVar2 == '\x02') {
      poVar5 = this->o;
      if (this_00->id == 4) {
        pcVar6 = "_f16";
      }
      else {
        pcVar6 = "16";
      }
      goto LAB_00b1efad;
    }
    if (uVar2 != '\x01') {
      abort();
    }
    std::operator<<(this->o,'8');
  }
  if (this_00->id != 4) {
    pcVar6 = "i64.load32_u";
    if (curr->signed_ != false) {
      pcVar6 = "i64.load32_s";
    }
    std::operator<<(this->o,pcVar6 + 10);
  }
LAB_00b1efd7:
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar5 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  }
  if ((curr->align).addr == (ulong)curr->bytes) {
    return;
  }
  poVar5 = std::operator<<(this->o," align=");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  return;
}

Assistant:

void visitLoad(Load* curr) {
    prepareColor(o) << forceConcrete(curr->type, curr->align);
    if (curr->isAtomic) {
      o << ".atomic";
    }
    o << ".load";
    if (curr->type != Type::unreachable &&
        curr->bytes < curr->type.getByteSize()) {
      if (curr->bytes == 1) {
        o << '8';
      } else if (curr->bytes == 2) {
        if (curr->type == Type::f32) {
          o << "_f16";
        } else {
          o << "16";
        }
      } else if (curr->bytes == 4) {
        o << "32";
      } else {
        abort();
      }
      if (curr->type != Type::f32) {
        o << (curr->signed_ ? "_s" : "_u");
      }
    }
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
    if (curr->align != curr->bytes) {
      o << " align=" << curr->align;
    }
  }